

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_ls.c
# Opt level: O0

int arkLSGetNumMassPrecEvals(void *arkode_mem,long *npevals)

{
  undefined8 *in_RSI;
  int retval;
  ARKLsMassMem arkls_mem;
  ARKodeMem ark_mem;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  ARKodeMem *in_stack_ffffffffffffffd8;
  char *in_stack_ffffffffffffffe0;
  int local_4;
  
  local_4 = arkLs_AccessMassMem(in_RSI,in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,
                                (ARKLsMassMem *)
                                CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0));
  if (local_4 == 0) {
    *in_RSI = in_stack_ffffffffffffffd8[0xe];
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int arkLSGetNumMassPrecEvals(void *arkode_mem, long int *npevals)
{
  ARKodeMem    ark_mem;
  ARKLsMassMem arkls_mem;
  int          retval;

  /* access ARKLsMassMem structure; set output value and return */
  retval = arkLs_AccessMassMem(arkode_mem, "arkLSGetNumMassPrecEvals",
                               &ark_mem, &arkls_mem);
  if (retval != ARK_SUCCESS)  return(retval);
  *npevals = arkls_mem->npe;
  return(ARKLS_SUCCESS);
}